

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::TextureCubeMipmapCase::init(TextureCubeMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  ostringstream *this_00;
  uint uVar2;
  pointer pPVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  TextureCube *this_01;
  ulong uVar6;
  long extraout_RAX;
  long lVar7;
  NotSupportedError *this_02;
  long lVar8;
  ulong uVar9;
  deUint32 step;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  iVar4 = (*this->m_renderCtxInfo->_vptr_ContextInfo[7])();
  if ((char)iVar4 == '\0') {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Warning: High precision not supported in fragment shaders.",0x3a)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  if ((this->m_coordType == COORDTYPE_PROJECTED) &&
     (iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])(),
     0 < *(int *)(CONCAT44(extraout_var,iVar4) + 0x20))) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Projected lookup validation not supported in multisample config"
               ,"");
    tcu::NotSupportedError::NotSupportedError(this_02,(string *)local_1b0);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this_01 = (TextureCube *)operator_new(0x180);
  glu::TextureCube::TextureCube
            (this_01,this->m_renderCtx,this->m_format,this->m_dataType,this->m_size);
  this->m_texture = this_01;
  uVar2 = this->m_size;
  if (uVar2 == 0) {
    uVar5 = 0x20;
  }
  else {
    uVar5 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = uVar5 ^ 0x1f;
  }
  uVar9 = 0;
  uVar6 = 0;
  if (0 < (int)(0x1f - uVar5)) {
    uVar6 = (ulong)(0x1f - uVar5);
  }
  lVar1 = uVar6 * 0x28 + 0x28;
  lVar7 = lVar1;
  do {
    if (uVar2 != 0) {
      lVar8 = 0;
      iVar4 = 0;
      do {
        if ((CubeFace)uVar9 < CUBEFACE_LAST) {
          iVar4 = (*(code *)(&DAT_01c0e280 + *(int *)(&DAT_01c0e280 + (uVar9 & 0xffffffff) * 4)))();
          return iVar4;
        }
        tcu::TextureCube::allocLevel(&this->m_texture->m_refTexture,(CubeFace)uVar9,iVar4);
        pPVar3 = (this->m_texture->m_refTexture).m_access[uVar9].
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        tcu::RGBA::toVec((RGBA *)local_1b0);
        tcu::clear((PixelBufferAccess *)
                   ((long)(pPVar3->super_ConstPixelBufferAccess).m_size.m_data + lVar8 + -8),
                   (Vec4 *)local_1b0);
        iVar4 = iVar4 + 1;
        lVar8 = lVar8 + 0x28;
        lVar7 = extraout_RAX;
      } while (lVar1 != lVar8);
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 6);
  return (int)lVar7;
}

Assistant:

void TextureCubeMipmapCase::init (void)
{
	if (!m_renderCtxInfo.isFragmentHighPrecisionSupported())
		m_testCtx.getLog() << TestLog::Message << "Warning: High precision not supported in fragment shaders." << TestLog::EndMessage;

	if (m_coordType == COORDTYPE_PROJECTED && m_renderCtx.getRenderTarget().getNumSamples() > 0)
		throw tcu::NotSupportedError("Projected lookup validation not supported in multisample config");

	m_texture = new TextureCube(m_renderCtx, m_format, m_dataType, m_size);

	int numLevels = deLog2Floor32(m_size)+1;

	// Fill texture with colored grid.
	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step		= 0xff / (numLevels-1);
			deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
			deUint32	dec			= 0xff - inc;
			deUint32	rgb			= 0;

			switch (faceNdx)
			{
				case 0: rgb = (inc << 16) | (dec << 8) | 255; break;
				case 1: rgb = (255 << 16) | (inc << 8) | dec; break;
				case 2: rgb = (dec << 16) | (255 << 8) | inc; break;
				case 3: rgb = (dec << 16) | (inc << 8) | 255; break;
				case 4: rgb = (255 << 16) | (dec << 8) | inc; break;
				case 5: rgb = (inc << 16) | (255 << 8) | dec; break;
			}

			deUint32	color		= 0xff000000 | rgb;

			m_texture->getRefTexture().allocLevel((tcu::CubeFace)faceNdx, levelNdx);
			tcu::clear(m_texture->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)faceNdx), tcu::RGBA(color).toVec());
		}
	}
}